

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

void wasm::Debug::writeDWARFSections(Module *wasm,BinaryLocations *newLocations)

{
  bool bVar1;
  type DCtx;
  size_type sVar2;
  reference this;
  pointer this_00;
  reference str;
  size_type sVar3;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *this_01;
  pointer this_02;
  size_t __new_size;
  iterator __first;
  iterator __last;
  char *__result;
  error_code eVar4;
  StringRef SVar5;
  bool local_60a;
  StringRef local_5f0;
  undefined1 local_5e0 [8];
  StringRef llvmData;
  undefined1 local_5c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> llvmName;
  CustomSection *section;
  iterator __end2;
  iterator __begin2;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *__range2;
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  newSections;
  undefined1 local_548 [7];
  bool is64;
  LocationUpdater locationUpdater;
  error_code local_1e0;
  undefined1 local_1d0 [8];
  Data data;
  BinaryenDWARFInfo info;
  BinaryLocations *newLocations_local;
  Module *wasm_local;
  
  info.context._M_t.
  super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
  super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
       (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
       newLocations;
  BinaryenDWARFInfo::BinaryenDWARFInfo
            ((BinaryenDWARFInfo *)
             &data.DebugLines.
              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,wasm);
  llvm::DWARFYAML::Data::Data((Data *)local_1d0);
  DCtx = std::unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>::operator*
                   ((unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> *)
                    &info.sections.field_0x18);
  eVar4 = dwarf2yaml(DCtx,(Data *)local_1d0);
  local_1e0._M_cat = eVar4._M_cat;
  local_1e0._M_value = eVar4._M_value;
  bVar1 = std::error_code::operator_cast_to_bool(&local_1e0);
  if (bVar1) {
    Fatal::Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
    Fatal::operator<<((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                      (char (*) [30])"Failed to parse DWARF to YAML");
    Fatal::~Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
  }
  LocationUpdater::LocationUpdater
            ((LocationUpdater *)local_548,wasm,
             (BinaryLocations *)
             info.context._M_t.
             super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
             super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl);
  updateDebugLines((Data *)local_1d0,(LocationUpdater *)local_548);
  sVar2 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::size(&wasm->memories);
  if (sVar2 == 0) {
    local_60a = false;
  }
  else {
    this = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[](&wasm->memories,0);
    this_00 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this);
    local_60a = Memory::is64(this_00);
  }
  newSections._31_1_ = local_60a;
  updateCompileUnits((BinaryenDWARFInfo *)
                     &data.DebugLines.
                      super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Data *)local_1d0,
                     (LocationUpdater *)local_548,local_60a);
  updateRanges((Data *)local_1d0,(LocationUpdater *)local_548);
  updateLoc((Data *)local_1d0,(LocationUpdater *)local_548);
  llvm::DWARFYAML::EmitDebugSections
            ((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)&__range2,(Data *)local_1d0,false);
  __end2 = std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::begin
                     (&wasm->customSections);
  section = (CustomSection *)
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end
                      (&wasm->customSections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                                     *)&section), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
          ::operator*(&__end2);
    wasm::Name::Name((Name *)((long)&llvmName.field_2 + 8),&str->name);
    bVar1 = IString::startsWith<8>((IString *)((long)&llvmName.field_2 + 8),(char (*) [8])".debug_")
    ;
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_5c0,(ulong)str);
      llvm::StringRef::StringRef((StringRef *)&llvmData.Length,(string *)local_5c0);
      sVar3 = llvm::
              StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              ::count((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                       *)&__range2,stack0xfffffffffffffa30);
      if (sVar3 != 0) {
        llvm::StringRef::StringRef(&local_5f0,(string *)local_5c0);
        this_01 = llvm::
                  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                  ::operator[]((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                                *)&__range2,local_5f0);
        this_02 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
                  operator->(this_01);
        SVar5 = llvm::MemoryBuffer::getBuffer(this_02);
        llvmData.Data = (char *)SVar5.Length;
        local_5e0 = (undefined1  [8])SVar5.Data;
        __new_size = llvm::StringRef::size((StringRef *)local_5e0);
        std::vector<char,_std::allocator<char>_>::resize(&str->data,__new_size);
        __first = llvm::StringRef::begin((StringRef *)local_5e0);
        __last = llvm::StringRef::end((StringRef *)local_5e0);
        __result = std::vector<char,_std::allocator<char>_>::data(&str->data);
        std::copy<char_const*,char*>(__first,__last,__result);
      }
      std::__cxx11::string::~string((string *)local_5c0);
    }
    __gnu_cxx::
    __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
    ::operator++(&__end2);
  }
  llvm::
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *)&__range2);
  LocationUpdater::~LocationUpdater((LocationUpdater *)local_548);
  llvm::DWARFYAML::Data::~Data((Data *)local_1d0);
  BinaryenDWARFInfo::~BinaryenDWARFInfo
            ((BinaryenDWARFInfo *)
             &data.DebugLines.
              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void writeDWARFSections(Module& wasm, const BinaryLocations& newLocations) {
  BinaryenDWARFInfo info(wasm);

  // Convert to Data representation, which YAML can use to write.
  llvm::DWARFYAML::Data data;
  if (dwarf2yaml(*info.context, data)) {
    Fatal() << "Failed to parse DWARF to YAML";
  }

  LocationUpdater locationUpdater(wasm, newLocations);

  updateDebugLines(data, locationUpdater);

  bool is64 = wasm.memories.size() > 0 ? wasm.memories[0]->is64() : false;
  updateCompileUnits(info, data, locationUpdater, is64);

  updateRanges(data, locationUpdater);

  updateLoc(data, locationUpdater);

  // Convert to binary sections.
  auto newSections =
    EmitDebugSections(data, false /* EmitFixups for debug_info */);

  // Update the custom sections in the wasm.
  // TODO: efficiency
  for (auto& section : wasm.customSections) {
    if (Name(section.name).startsWith(".debug_")) {
      auto llvmName = section.name.substr(1);
      if (newSections.count(llvmName)) {
        auto llvmData = newSections[llvmName]->getBuffer();
        section.data.resize(llvmData.size());
        std::copy(llvmData.begin(), llvmData.end(), section.data.data());
      }
    }
  }
}